

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::relative(path *__return_storage_ptr__,path *p,error_code *ec)

{
  path local_40;
  error_code *local_20;
  error_code *ec_local;
  path *p_local;
  
  local_20 = ec;
  ec_local = (error_code *)p;
  p_local = __return_storage_ptr__;
  current_path(&local_40,ec);
  relative(__return_storage_ptr__,p,&local_40,local_20);
  path::~path(&local_40);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path relative(const path& p, std::error_code& ec)
{
    return relative(p, current_path(ec), ec);
}